

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Diligent::SplitPath<std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Diligent *this,Char *Path,bool Simplify)

{
  bool bVar1;
  reference __lhs;
  byte local_64;
  char *local_50;
  Char *CmpStart;
  Char *c;
  Diligent *local_30;
  Char *c_1;
  size_t CompnentCount;
  anon_class_1_0_00000001 IsSlash;
  Diligent *pDStack_18;
  bool Simplify_local;
  Char *Path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *Components;
  
  CompnentCount._7_1_ = (byte)Path & 1;
  CompnentCount._6_1_ = 0;
  pDStack_18 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  c_1 = (Char *)0x1;
  for (local_30 = pDStack_18; *local_30 != (Diligent)0x0; local_30 = local_30 + 1) {
    bVar1 = SplitPath<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&CompnentCount + 5),(Char)*local_30);
    if ((bVar1) &&
       (bVar1 = SplitPath<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&CompnentCount + 5),(Char)local_30[1]),
       !bVar1)) {
      c_1 = c_1 + 1;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,(size_type)c_1);
  CmpStart = (Char *)pDStack_18;
LAB_0082f866:
  if (*CmpStart != '\0') {
    while (bVar1 = SplitPath<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::anon_class_1_0_00000001::operator()
                             ((anon_class_1_0_00000001 *)((long)&CompnentCount + 5),*CmpStart),
          bVar1) {
      CmpStart = CmpStart + 1;
    }
    if (*CmpStart != '\0') {
      local_50 = CmpStart;
      while( true ) {
        local_64 = 0;
        if (*CmpStart != '\0') {
          bVar1 = SplitPath<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)((long)&CompnentCount + 5),*CmpStart);
          local_64 = bVar1 ^ 0xff;
        }
        if ((local_64 & 1) == 0) break;
        CmpStart = CmpStart + 1;
      }
      if ((CompnentCount._7_1_ & 1) != 0) goto code_r0x0082f90c;
      goto LAB_0082f99f;
    }
  }
  return __return_storage_ptr__;
code_r0x0082f90c:
  if (((long)CmpStart - (long)local_50 != 1) || (*local_50 != '.')) {
    if (((long)CmpStart - (long)local_50 == 2) &&
       (((*local_50 == '.' && (local_50[1] == '.')) &&
        (bVar1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty(__return_storage_ptr__), !bVar1)))) {
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back(__return_storage_ptr__);
      bVar1 = std::operator!=(__lhs,"..");
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(__return_storage_ptr__);
        goto LAB_0082f866;
      }
    }
LAB_0082f99f:
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*const&,char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50,&CmpStart);
  }
  goto LAB_0082f866;
}

Assistant:

std::vector<StringType> SplitPath(const Char* Path, bool Simplify)
{
    std::vector<StringType> Components;

    // BasicFileSystem::IsSlash() does not get inlined by at least MSVC
    auto IsSlash = [](Char c) {
        return c == '/' || c == '\\';
    };

    // Estimate the number of components and reserve space in the vector
    {
        size_t CompnentCount = 1;
        for (const auto* c = Path; *c != '\0'; ++c)
        {
            if (IsSlash(c[0]) && !IsSlash(c[1]))
                ++CompnentCount;
        }
        Components.reserve(CompnentCount);
    }

    const auto* c = Path;
    while (*c != '\0')
    {
        while (IsSlash(*c))
            ++c;

        if (*c == '\0')
        {
            // a/
            break;
        }

        const auto* const CmpStart = c;
        while (*c != '\0' && !IsSlash(*c))
            ++c;

        if (Simplify)
        {
            if ((c - CmpStart) == 1 && CmpStart[0] == '.') // "."
            {
                // Skip /.
                continue;
            }
            else if ((c - CmpStart) == 2 && CmpStart[0] == '.' && CmpStart[1] == '.') // ".."
            {
                // Pop previous subdirectory if "/.." is found, but only if there is
                // no ".." already (e.g "../..")
                if (!Components.empty() && Components.back() != "..")
                {
                    Components.pop_back();
                    continue;
                }
            }
        }

        Components.emplace_back(CmpStart, c);
    }

    return Components;
}